

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

bool __thiscall
ASDCP::MXF::SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Unarchive
          (SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this,MemIOReader *Reader)

{
  bool bVar1;
  PartitionPair Tmp;
  PartitionPair local_40;
  
  bVar1 = true;
  while ((bVar1 != false && (*(int *)(Reader + 8) != *(int *)(Reader + 0xc)))) {
    local_40.super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_0010ad10;
    local_40.BodySID = 0;
    local_40.ByteOffset = 0;
    bVar1 = RIP::PartitionPair::Unarchive(&local_40,Reader);
    if (bVar1) {
      std::__cxx11::
      list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::
      push_back(&this->
                 super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                ,&local_40);
    }
  }
  return bVar1;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader)
	    {
	      bool result = true;

	      while ( Reader->Remainder() > 0 && result )
		{
		  T Tmp;
		  result = Tmp.Unarchive(Reader);

		  if ( result )
		    {
		      this->push_back(Tmp);
		    }
		}

	      return result;
	    }